

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l5_full.c
# Opt level: O0

int picnic_l5_full_validate_keypair(picnic_l5_full_privatekey_t *sk,picnic_l5_full_publickey_t *pk)

{
  undefined1 (*in_RSI) [32];
  long in_RDI;
  uint8_t buffer [32];
  mzd_local_t ciphertext [1];
  mzd_local_t privkey [1];
  mzd_local_t plaintext [1];
  uint8_t *pk_c;
  uint8_t *pk_pt;
  uint8_t *sk_c;
  uint8_t *sk_pt;
  uint8_t *sk_sk;
  picnic_instance_t *instance;
  undefined1 auStackY_100 [16];
  mzd_local_t *in_stack_ffffffffffffff10;
  mzd_local_t *in_stack_ffffffffffffff18;
  lowmc_key_t *in_stack_ffffffffffffff20;
  lowmc_parameters_t *in_stack_ffffffffffffff28;
  mzd_local_t *in_stack_ffffffffffffff30;
  mzd_local_t *in_stack_ffffffffffffff38;
  int local_34;
  
  if ((in_RDI == 0) || (in_RSI == (undefined1 (*) [32])0x0)) {
    local_34 = -1;
  }
  else {
    picnic_instance_get(Picnic_L5_full);
    if ((*(undefined1 (*) [32])(in_RDI + 0x40) == in_RSI[1]) &&
       (*(undefined1 (*) [32])(in_RDI + 0x20) == *in_RSI)) {
      mzd_from_char_array(in_stack_ffffffffffffff38,(uint8_t *)in_stack_ffffffffffffff30,
                          (size_t)in_stack_ffffffffffffff28);
      mzd_from_char_array(in_stack_ffffffffffffff38,(uint8_t *)in_stack_ffffffffffffff30,
                          (size_t)in_stack_ffffffffffffff28);
      lowmc_compute(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                    in_stack_ffffffffffffff10);
      mzd_to_char_array((uint8_t *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                        (size_t)in_stack_ffffffffffffff28);
      local_34 = memcmp(auStackY_100,in_RSI,0x20);
    }
    else {
      local_34 = -1;
    }
  }
  return local_34;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l5_full_validate_keypair(const picnic_l5_full_privatekey_t* sk,
                                                            const picnic_l5_full_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_pt = SK_PT(sk);
  const uint8_t* sk_c  = SK_C(sk);
  const uint8_t* pk_pt = PK_PT(pk);
  const uint8_t* pk_c  = PK_C(pk);

  // check param and plaintext
  if (memcmp(sk_pt, pk_pt, LOWMC_BLOCK_SZ) != 0 || memcmp(sk_c, pk_c, LOWMC_BLOCK_SZ) != 0) {
    return -1;
  }

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(privkey, sk_sk, LOWMC_BLOCK_SZ);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  uint8_t buffer[MAX_LOWMC_BLOCK_SIZE];
  mzd_to_char_array(buffer, ciphertext, LOWMC_BLOCK_SZ);

  return memcmp(buffer, pk_c, LOWMC_BLOCK_SZ);
}